

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

xmlBufPtr xmlBufCreate(void)

{
  int *piVar1;
  xmlBufferAllocationScheme *pxVar2;
  xmlChar *pxVar3;
  xmlBufPtr ret;
  
  ret = (xmlBufPtr)(*xmlMalloc)(0x40);
  if (ret == (xmlBufPtr)0x0) {
    xmlBufMemoryError((xmlBufPtr)0x0,"creating buffer");
    ret = (xmlBufPtr)0x0;
  }
  else {
    ret->use = 0;
    ret->error = 0;
    ret->buffer = (xmlBufferPtr)0x0;
    piVar1 = __xmlDefaultBufferSize();
    ret->size = (long)*piVar1;
    if (ret->size < 0x7fffffff) {
      ret->compat_size = (uint)ret->size;
    }
    else {
      ret->compat_size = 0x7fffffff;
    }
    if (ret->use < 0x7fffffff) {
      ret->compat_use = (uint)ret->use;
    }
    else {
      ret->compat_use = 0x7fffffff;
    }
    pxVar2 = __xmlBufferAllocScheme();
    ret->alloc = *pxVar2;
    pxVar3 = (xmlChar *)(*xmlMallocAtomic)(ret->size);
    ret->content = pxVar3;
    if (ret->content == (xmlChar *)0x0) {
      xmlBufMemoryError(ret,"creating buffer");
      (*xmlFree)(ret);
      ret = (xmlBufPtr)0x0;
    }
    else {
      *ret->content = '\0';
      ret->contentIO = (xmlChar *)0x0;
    }
  }
  return ret;
}

Assistant:

xmlBufPtr
xmlBufCreate(void) {
    xmlBufPtr ret;

    ret = (xmlBufPtr) xmlMalloc(sizeof(xmlBuf));
    if (ret == NULL) {
	xmlBufMemoryError(NULL, "creating buffer");
        return(NULL);
    }
    ret->use = 0;
    ret->error = 0;
    ret->buffer = NULL;
    ret->size = xmlDefaultBufferSize;
    UPDATE_COMPAT(ret);
    ret->alloc = xmlBufferAllocScheme;
    ret->content = (xmlChar *) xmlMallocAtomic(ret->size);
    if (ret->content == NULL) {
	xmlBufMemoryError(ret, "creating buffer");
	xmlFree(ret);
        return(NULL);
    }
    ret->content[0] = 0;
    ret->contentIO = NULL;
    return(ret);
}